

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miscellaneous.cpp
# Opt level: O0

void __thiscall chatra::Lock::releaseIfExists(Lock *this,Reference ref,LockType lockType)

{
  size_type sVar1;
  LockType lockType_local;
  Lock *this_local;
  Reference ref_local;
  
  this_local = (Lock *)ref.node;
  sVar1 = std::
          unordered_set<chatra::Reference,_std::hash<chatra::Reference>,_std::equal_to<chatra::Reference>,_std::allocator<chatra::Reference>_>
          ::erase(this->refs + (int)lockType,(key_type *)&this_local);
  if (sVar1 != 0) {
    Reference::unlock((Reference *)&this_local);
  }
  return;
}

Assistant:

void Lock::releaseIfExists(Reference ref, LockType lockType) {
	chatra_assert(!methodCall);
	CHATRA_DEBUG_LOCK_AUDIT;
	if (refs[static_cast<size_t>(lockType)].erase(ref) != 0) {
		CHATRA_DEBUG_LOCK_LOG1("releaseIfExists_exists", ref, lockType);
		ref.unlock();
	}
	else
		CHATRA_DEBUG_LOCK_LOG1("releaseIfExists_does_not_exist", ref, lockType);
}